

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9FFTest(Abc_Frame_t *pAbc,int argc,char **argv)

{
  byte bVar1;
  Abc_Frame_t *pAVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Io_FileType_t FileType;
  FILE *pFVar6;
  size_t sVar7;
  Abc_Ntk_t *pNtk;
  Gia_Man_t *pGVar8;
  char **ppNamesIn;
  char *pcVar9;
  char *pcVar10;
  Gia_Man_t *pG;
  Bmc_ParFf_t Pars;
  Gia_Man_t *pGold;
  char *local_a8;
  Bmc_ParFf_t local_a0;
  char *local_50;
  Gia_Man_t *local_48;
  Abc_Ntk_t *local_40;
  Abc_Frame_t *local_38;
  
  local_48 = (Gia_Man_t *)0x0;
  local_38 = pAbc;
  Gia_ParFfSetDefault(&local_a0);
  local_a8 = (char *)0x0;
  Extra_UtilGetoptReset();
  local_50 = (char *)0x0;
LAB_0028ce55:
  while (iVar3 = Extra_UtilGetopt(argc,argv,"ATNKSGFkbsfcdeunvh"), iVar5 = globalUtilOptind,
        0x61 < iVar3) {
    switch(iVar3) {
    case 0x62:
      local_a0.fBasic = local_a0.fBasic ^ 1;
      break;
    case 99:
      local_a0.fCheckUntest = local_a0.fCheckUntest ^ 1;
      break;
    case 100:
      local_a0.fDump = local_a0.fDump ^ 1;
      break;
    case 0x65:
      local_a0.fDumpDelay = local_a0.fDumpDelay ^ 1;
      break;
    case 0x66:
      local_a0.fFfOnly = local_a0.fFfOnly ^ 1;
      break;
    default:
      goto switchD_0028ce7b_caseD_67;
    case 0x6b:
      local_a0.fNonStrict = local_a0.fNonStrict ^ 1;
      break;
    case 0x6e:
      local_a0.fDumpNewFaults = local_a0.fDumpNewFaults ^ 1;
      break;
    case 0x73:
      local_a0.fStartPats = local_a0.fStartPats ^ 1;
      break;
    case 0x75:
      local_a0.fDumpUntest = local_a0.fDumpUntest ^ 1;
      break;
    case 0x76:
      local_a0.fVerbose = local_a0.fVerbose ^ 1;
    }
  }
  switch(iVar3) {
  case 0x46:
    if (globalUtilOptind < argc) {
      local_a8 = argv[globalUtilOptind];
LAB_0028cf17:
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0028ce55;
    }
    pcVar9 = "Command line switch \"-F\" should be followed by a file name.\n";
    break;
  case 0x47:
    if (globalUtilOptind < argc) {
      local_50 = argv[globalUtilOptind];
      goto LAB_0028cf17;
    }
    pcVar9 = "Command line switch \"-G\" should be followed by a file name.\n";
    break;
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4c:
  case 0x4d:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
    goto switchD_0028ce7b_caseD_67;
  case 0x4b:
    if (globalUtilOptind < argc) {
      local_a0.nCardConstr = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar5 + 1;
      if (local_a0.nCardConstr < 1) goto switchD_0028ce7b_caseD_67;
      goto LAB_0028ce55;
    }
    pcVar9 = "Command line switch \"-K\" should be followed by an integer.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      uVar4 = atoi(argv[globalUtilOptind]);
      local_a0.nIterCheck = uVar4;
LAB_0028cf8d:
      globalUtilOptind = iVar5 + 1;
      if ((int)uVar4 < 0) {
switchD_0028ce7b_caseD_67:
        Abc_Print(-2,"usage: &fftest [-ATNK num] [-kbsfcdeunvh] <file> [-GF file] [-S str]\n");
        Abc_Print(-2,"\t          performs functional fault test generation\n");
        Abc_Print(-2,"\t-A num  : selects fault model for all gates [default = %d]\n",
                  (ulong)(uint)local_a0.Algo);
        Abc_Print(-2,"\t                0: fault model is not selected (use -S str)\n");
        Abc_Print(-2,"\t                1: delay fault testing for sequential circuits\n");
        Abc_Print(-2,"\t                2: traditional stuck-at fault: -S (((a&b)&~p)|q)\n");
        Abc_Print(-2,"\t                3: complement fault: -S ((a&b)^p)\n");
        Abc_Print(-2,"\t                4: functionally observable fault\n");
        Abc_Print(-2,"\t-T num  : specifies approximate runtime limit in seconds [default = %d]\n",
                  (ulong)(uint)local_a0.nTimeOut);
        Abc_Print(-2,
                  "\t-N num  : specifies iteration to check for fixed parameters [default = %d]\n",
                  (ulong)(uint)local_a0.nIterCheck);
        Abc_Print(-2,"\t-K num  : specifies cardinality constraint (num > 0) [default = unused]\n");
        pcVar10 = "yes";
        pcVar9 = "yes";
        if (local_a0.fNonStrict == 0) {
          pcVar9 = "no";
        }
        Abc_Print(-2,
                  "\t-k      : toggles non-strict cardinality (n <= K, instead of n == K) [default = %s]\n"
                  ,pcVar9);
        pcVar9 = "yes";
        if (local_a0.fBasic == 0) {
          pcVar9 = "no";
        }
        Abc_Print(-2,
                  "\t-b      : toggles testing for single faults (the same as \"-K 1\") [default = %s]\n"
                  ,pcVar9);
        pcVar9 = "yes";
        if (local_a0.fStartPats == 0) {
          pcVar9 = "no";
        }
        Abc_Print(-2,
                  "\t-s      : toggles starting with the all-0 and all-1 patterns [default = %s]\n",
                  pcVar9);
        pcVar9 = "yes";
        if (local_a0.fFfOnly == 0) {
          pcVar9 = "no";
        }
        Abc_Print(-2,
                  "\t-f      : toggles faults at flop inputs only with \"-A 1\" and \"-S str\" [default = %s]\n"
                  ,pcVar9);
        pcVar9 = "yes";
        if (local_a0.fCheckUntest == 0) {
          pcVar9 = "no";
        }
        Abc_Print(-2,"\t-c      : toggles checking if there are untestable faults [default = %s]\n",
                  pcVar9);
        pcVar9 = "yes";
        if (local_a0.fDump == 0) {
          pcVar9 = "no";
        }
        Abc_Print(-2,
                  "\t-d      : toggles dumping test patterns into file \"<file>_tests.txt\" [default = %s]\n"
                  ,pcVar9);
        pcVar9 = "yes";
        if (local_a0.fDumpDelay == 0) {
          pcVar9 = "no";
        }
        Abc_Print(-2,
                  "\t-e      : toggles dumping test pattern pairs (delay faults only) [default = %s]\n"
                  ,pcVar9);
        pcVar9 = "yes";
        if (local_a0.fDumpUntest == 0) {
          pcVar9 = "no";
        }
        Abc_Print(-2,
                  "\t-u      : toggles dumping untestable faults into \"<file>_untest.txt\" [default = %s]\n"
                  ,pcVar9);
        pcVar9 = "yes";
        if (local_a0.fDumpNewFaults == 0) {
          pcVar9 = "no";
        }
        Abc_Print(-2,
                  "\t-n      : toggles dumping faults not detected by a given test set [default = %s]\n"
                  ,pcVar9);
        if (local_a0.fVerbose == 0) {
          pcVar10 = "no";
        }
        Abc_Print(-2,"\t-v      : toggles printing verbose information [default = %s]\n",pcVar10);
        Abc_Print(-2,"\t-h      : print the command usage\n");
        Abc_Print(-2,"\t<file>  : (optional) file name with input test patterns\n\n");
        Abc_Print(-2,"\t-G file : (optional) file name with the golden model\n\n");
        Abc_Print(-2,"\t-F file : (optional) file name with the fault model in BLIF format\n");
        Abc_Print(-2,"\t-S str  : (optional) string representing the fault model\n");
        Abc_Print(-2,"\t          The following notations are used:\n");
        Abc_Print(-2,"\t            Functional variables: {a,b} (both a and b are always present)\n"
                 );
        Abc_Print(-2,
                  "\t            Parameter variables: {p,q,r,s,t,u,v,w} (any number from 1 to 8)\n")
        ;
        Abc_Print(-2,"\t            Boolean operators: AND(&), OR(|), XOR(^), MUX(?:), NOT(~)\n");
        Abc_Print(-2,
                  "\t            Parentheses should be used around each operator. Spaces not allowed.\n"
                 );
        Abc_Print(-2,
                  "\t            Complement (~) is only allowed before variables (use DeMorgan law).\n"
                 );
        Abc_Print(-2,"\t            Examples:\n");
        Abc_Print(-2,"\t              (((a&b)&~p)|q)        stuck-at-0/1 at the output\n");
        Abc_Print(-2,"\t              (((a&~p)|q)&b)        stuck-at-0/1 at input a\n");
        Abc_Print(-2,
                  "\t              (((a|p)&(b|q))&~r)    stuck-at-1 at the inputs and stuck-at-0 at the output\n"
                 );
        Abc_Print(-2,
                  "\t              (((a&~p)&(b&~q))|r)   stuck-at-0 at the inputs and stuck-at-1 at the output\n"
                 );
        Abc_Print(-2,"\t              ((a&b)^p)             complement at the output\n");
        Abc_Print(-2,
                  "\t              (((a^p)&(b^q))^r)     complement at the inputs and at the output\n"
                 );
        Abc_Print(-2,
                  "\t              (a?(b?~s:r):(b?q:p))  functionally observable fault at the output\n"
                 );
        Abc_Print(-2,"\t              (p?(a|b):(a&b))       replace AND by OR\n");
        Abc_Print(-2,
                  "\t           If the BLIF file is used for the formula with option \'-F\', following rules apply:\n"
                 );
        Abc_Print(-2,
                  "\t              - the network should be combinational and have exactly one primary output\n"
                 );
        Abc_Print(-2,"\t              - input names should have only one character:\n");
        Abc_Print(-2,"\t                {a, b} (for functional variables)\n");
        Abc_Print(-2,"\t                {p,q,r,s,t,u,v,w} (for parameter variables)\n");
        return 1;
      }
      goto LAB_0028ce55;
    }
    pcVar9 = "Command line switch \"-N\" should be followed by an integer.\n";
    break;
  case 0x53:
    if (globalUtilOptind < argc) {
      local_a0.pFormStr = argv[globalUtilOptind];
      goto LAB_0028cf17;
    }
    pcVar9 = "Command line switch \"-S\" should be followed by a string.\n";
    break;
  case 0x54:
    if (globalUtilOptind < argc) {
      uVar4 = atoi(argv[globalUtilOptind]);
      local_a0.nTimeOut = uVar4;
      goto LAB_0028cf8d;
    }
    pcVar9 = "Command line switch \"-T\" should be followed by an integer.\n";
    break;
  default:
    if (iVar3 != 0x41) {
      if (iVar3 == -1) {
        if (local_a8 == (char *)0x0) goto LAB_0028d5d6;
        pcVar9 = Extra_FileNameExtension(local_a8);
        iVar5 = strcmp(pcVar9,"blif");
        if (iVar5 != 0) {
          pFVar6 = fopen(local_a8,"r");
          if (pFVar6 == (FILE *)0x0) {
            pcVar10 = "Abc_CommandAbc9FFTest(): File name \"%s\" with formula is invalid.\n";
            pcVar9 = local_a8;
            goto LAB_0028d571;
          }
          local_a0.pFormStr = Extra_FileRead((FILE *)pFVar6);
          fclose(pFVar6);
          while( true ) {
            pcVar9 = local_a0.pFormStr;
            sVar7 = strlen(local_a0.pFormStr);
            iVar5 = (int)sVar7 + -1;
            bVar1 = pcVar9[iVar5];
            if (((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) &&
               (bVar1 != 0xcd)) break;
            pcVar9[iVar5] = '\0';
          }
LAB_0028d5be:
          printf("Using formula \"%s\" from file \"%s\".\n",pcVar9,local_a8);
LAB_0028d5d6:
          if (local_a0.pFormStr == (char *)0x0 && local_a0.Algo == 0) {
            pcVar9 = "Formula string (-S <str>) should be selected when algorithm is 0 (-A 0).\n";
          }
          else {
            if (local_a0.Algo != 0 && local_a0.pFormStr != (char *)0x0) {
              pcVar9 = "Algorithm should be 0 (-A 0) when formula string is selected (-S <str>).\n";
              goto LAB_0028d673;
            }
            if (globalUtilOptind + 1 == argc) {
              local_a0.pFileName = argv[globalUtilOptind];
              pFVar6 = fopen(local_a0.pFileName,"r");
              if (pFVar6 == (FILE *)0x0) {
                pcVar10 = "Cannot open file \"%s\" with the input test patterns.\n";
                pcVar9 = local_a0.pFileName;
                goto LAB_0028d571;
              }
              fclose(pFVar6);
            }
            pAVar2 = local_38;
            pcVar9 = local_50;
            pGVar8 = local_38->pGia;
            if (pGVar8 == (Gia_Man_t *)0x0) {
              pcVar9 = "Abc_CommandAbc9FFTest(): There is no AIG.\n";
            }
            else {
              if ((pGVar8->nRegs != 0) || (local_a0.Algo != 1)) {
                if (local_50 == (char *)0x0) {
LAB_0028d72e:
                  pG = local_48;
                  if (local_48 == (Gia_Man_t *)0x0) {
                    pG = pGVar8;
                  }
                  Gia_ManFaultTest(pGVar8,pG,&local_a0);
                  Gia_ManStopP(&local_48);
                  if (local_a8 == (char *)0x0) {
                    return 0;
                  }
                  if (local_a0.pFormStr == (char *)0x0) {
                    return 0;
                  }
                  free(local_a0.pFormStr);
                  return 0;
                }
                pFVar6 = fopen(local_50,"r");
                if (pFVar6 == (FILE *)0x0) {
                  pcVar10 = 
                  "Abc_CommandAbc9FFTest(): File name \"%s\" with golden model is invalid.\n";
                }
                else {
                  fclose(pFVar6);
                  local_48 = Gia_AigerRead(pcVar9,0,0,0);
                  if (local_48 != (Gia_Man_t *)0x0) {
                    pGVar8 = pAVar2->pGia;
                    if (pGVar8->vCis->nSize - pGVar8->nRegs ==
                        local_48->vCis->nSize - local_48->nRegs) {
                      if (pGVar8->vCos->nSize - pGVar8->nRegs ==
                          local_48->vCos->nSize - local_48->nRegs) {
                        printf("Entered spec AIG from file \"%s\".\n",pcVar9);
                        pGVar8 = pAVar2->pGia;
                        goto LAB_0028d72e;
                      }
                      Gia_ManStop(local_48);
                      pcVar9 = 
                      "Abc_CommandAbc9FFTest(): Old model and gold model have different number of POs.\n"
                      ;
                    }
                    else {
                      Gia_ManStop(local_48);
                      pcVar9 = 
                      "Abc_CommandAbc9FFTest(): Old model and gold model have different number of PIs.\n"
                      ;
                    }
                    goto LAB_0028d673;
                  }
                  pcVar10 = "Abc_CommandAbc9FFTest(): Cannot read file \"%s\" with golden model.\n";
                  local_48 = (Gia_Man_t *)0x0;
                }
LAB_0028d571:
                Abc_Print(-1,pcVar10,pcVar9);
                return 0;
              }
              pcVar9 = "Abc_CommandAbc9FFTest(): For delay testing, AIG should be sequential.\n";
            }
          }
LAB_0028d673:
          Abc_Print(-1,pcVar9);
          return 0;
        }
        FileType = Io_ReadFileType(local_a8);
        pNtk = Io_Read(local_a8,FileType,1,0);
        local_40 = Abc_NtkStrash(pNtk,0,0,0);
        pGVar8 = Abc_NtkClpGia(local_40);
        ppNamesIn = Abc_NtkCollectCioNames(pNtk,0);
        if (pGVar8->vCos->nSize == 1) {
          local_a0.pFormStr = Gia_DeriveFormula(pGVar8,ppNamesIn);
        }
        else {
          puts("The formula BLIF file contains the network with more one output.");
        }
        if (ppNamesIn != (char **)0x0) {
          free(ppNamesIn);
        }
        Gia_ManStop(pGVar8);
        Abc_NtkDelete(pNtk);
        Abc_NtkDelete(local_40);
        pcVar9 = local_a0.pFormStr;
        if (local_a0.pFormStr != (char *)0x0) goto LAB_0028d5be;
      }
      goto switchD_0028ce7b_caseD_67;
    }
    if (argc <= globalUtilOptind) {
      pcVar9 = "Command line switch \"-A\" should be followed by an integer.\n";
      break;
    }
    local_a0.Algo = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if (4 < (uint)local_a0.Algo) goto switchD_0028ce7b_caseD_67;
    goto LAB_0028ce55;
  }
  Abc_Print(-1,pcVar9);
  goto switchD_0028ce7b_caseD_67;
}

Assistant:

int Abc_CommandAbc9FFTest( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ParFfSetDefault( Bmc_ParFf_t * p );
    extern void Gia_ManFaultTest( Gia_Man_t * p, Gia_Man_t * pG, Bmc_ParFf_t * pPars );
    Bmc_ParFf_t Pars, * pPars = &Pars;
    char * pFileName = NULL, * pFileName2 = NULL;
    Gia_Man_t * pGold = NULL;
    int c;
    Gia_ParFfSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ATNKSGFkbsfcdeunvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->Algo = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Algo < 0 || pPars->Algo > 4 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterCheck = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterCheck < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nCardConstr = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCardConstr <= 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a string.\n" );
                goto usage;
            }
            pPars->pFormStr = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a file name.\n" );
                goto usage;
            }
            pFileName2 = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a file name.\n" );
                goto usage;
            }
            pFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'k':
            pPars->fNonStrict ^= 1;
            break;
        case 'b':
            pPars->fBasic ^= 1;
            break;
        case 's':
            pPars->fStartPats ^= 1;
            break;
        case 'f':
            pPars->fFfOnly ^= 1;
            break;
        case 'c':
            pPars->fCheckUntest ^= 1;
            break;
        case 'd':
            pPars->fDump ^= 1;
            break;
        case 'e':
            pPars->fDumpDelay ^= 1;
            break;
        case 'u':
            pPars->fDumpUntest ^= 1;
            break;
        case 'n':
            pPars->fDumpNewFaults ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    // read string from file
    if ( pFileName2 )
    {
        if ( !strcmp( Extra_FileNameExtension(pFileName2), "blif" ) )
        {
            extern char * Gia_DeriveFormula( Gia_Man_t * pGia, char ** ppNamesIn );
            Abc_Ntk_t * pNtk2 = Io_Read( pFileName2, Io_ReadFileType(pFileName2), 1, 0 );
            Abc_Ntk_t * pNtk3 = Abc_NtkStrash( pNtk2, 0, 0, 0 );
            Gia_Man_t * pGia  = Abc_NtkClpGia( pNtk3 );
            char ** ppNamesIn = Abc_NtkCollectCioNames( pNtk2, 0 );
            if ( Gia_ManCoNum(pGia) == 1 )
                pPars->pFormStr = Gia_DeriveFormula( pGia, ppNamesIn );
            else
                printf( "The formula BLIF file contains the network with more one output.\n" );
            ABC_FREE( ppNamesIn );
            Gia_ManStop( pGia );
            Abc_NtkDelete( pNtk2 );
            Abc_NtkDelete( pNtk3 );
            if ( pPars->pFormStr == NULL )
                goto usage;
        }
        else
        {
            FILE * pFile = fopen( pFileName2, "r" );
            if ( pFile == NULL )
            {
                Abc_Print( -1, "Abc_CommandAbc9FFTest(): File name \"%s\" with formula is invalid.\n", pFileName2 );
                return 0;
            }
            pPars->pFormStr = Extra_FileRead(pFile);
            fclose( pFile );
            // skip spaces
            while ( 1 )
            {
                int Len = strlen(pPars->pFormStr);
                char Char = pPars->pFormStr[Len-1];
                if ( Char == ' ' || Char == '\n' || Char == '\r' || Char == '\t' || Char == -51 )
                    pPars->pFormStr[Len-1] = '\0';
                else
                    break;
            }
        }
        printf( "Using formula \"%s\" from file \"%s\".\n", pPars->pFormStr, pFileName2 );
    }
    if ( pPars->Algo == 0 && pPars->pFormStr == NULL )
    {
        Abc_Print( -1, "Formula string (-S <str>) should be selected when algorithm is 0 (-A 0).\n" );
        return 0;
    }
    if ( pPars->Algo != 0 && pPars->pFormStr != NULL )
    {
        Abc_Print( -1, "Algorithm should be 0 (-A 0) when formula string is selected (-S <str>).\n" );
        return 0;
    }
    // get the file name
    if ( argc == globalUtilOptind + 1 )
    {
        FILE * pFile;
        pPars->pFileName = argv[globalUtilOptind];
        pFile = fopen( pPars->pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Cannot open file \"%s\" with the input test patterns.\n", pPars->pFileName );
            return 0;
        }
        fclose( pFile );
    }
    // check other conditions
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9FFTest(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 && pPars->Algo == 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9FFTest(): For delay testing, AIG should be sequential.\n" );
        return 0;
    }
    // check if the file is valid
    if ( pFileName )
    {
        FILE * pFile = fopen( pFileName, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): File name \"%s\" with golden model is invalid.\n", pFileName );
            return 0;
        }
        fclose( pFile );
        pGold = Gia_AigerRead( pFileName, 0, 0, 0 );
        if ( pGold == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Cannot read file \"%s\" with golden model.\n", pFileName );
            return 0;
        }
        if ( Gia_ManPiNum(pAbc->pGia) != Gia_ManPiNum(pGold) )
        {
            Gia_ManStop( pGold );
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Old model and gold model have different number of PIs.\n" );
            return 0;
        }
        if ( Gia_ManPoNum(pAbc->pGia) != Gia_ManPoNum(pGold) )
        {
            Gia_ManStop( pGold );
            Abc_Print( -1, "Abc_CommandAbc9FFTest(): Old model and gold model have different number of POs.\n" );
            return 0;
        }
        printf( "Entered spec AIG from file \"%s\".\n", pFileName );
    }
    Gia_ManFaultTest( pAbc->pGia, pGold ? pGold : pAbc->pGia, pPars );
    Gia_ManStopP( &pGold );
    if ( pFileName2 )
        ABC_FREE( pPars->pFormStr );
    return 0;

usage:
    Abc_Print( -2, "usage: &fftest [-ATNK num] [-kbsfcdeunvh] <file> [-GF file] [-S str]\n" );
    Abc_Print( -2, "\t          performs functional fault test generation\n" );
    Abc_Print( -2, "\t-A num  : selects fault model for all gates [default = %d]\n", pPars->Algo );
    Abc_Print( -2, "\t                0: fault model is not selected (use -S str)\n" );
    Abc_Print( -2, "\t                1: delay fault testing for sequential circuits\n" );
    Abc_Print( -2, "\t                2: traditional stuck-at fault: -S (((a&b)&~p)|q)\n" );
    Abc_Print( -2, "\t                3: complement fault: -S ((a&b)^p)\n" );
    Abc_Print( -2, "\t                4: functionally observable fault\n" );
    Abc_Print( -2, "\t-T num  : specifies approximate runtime limit in seconds [default = %d]\n",        pPars->nTimeOut );
    Abc_Print( -2, "\t-N num  : specifies iteration to check for fixed parameters [default = %d]\n",     pPars->nIterCheck );
    Abc_Print( -2, "\t-K num  : specifies cardinality constraint (num > 0) [default = unused]\n" );
    Abc_Print( -2, "\t-k      : toggles non-strict cardinality (n <= K, instead of n == K) [default = %s]\n",pPars->fNonStrict?  "yes": "no" );
    Abc_Print( -2, "\t-b      : toggles testing for single faults (the same as \"-K 1\") [default = %s]\n", pPars->fBasic?      "yes": "no" );
    Abc_Print( -2, "\t-s      : toggles starting with the all-0 and all-1 patterns [default = %s]\n",    pPars->fStartPats?  "yes": "no" );
    Abc_Print( -2, "\t-f      : toggles faults at flop inputs only with \"-A 1\" and \"-S str\" [default = %s]\n",          pPars->fFfOnly?     "yes": "no" );
    Abc_Print( -2, "\t-c      : toggles checking if there are untestable faults [default = %s]\n",       pPars->fCheckUntest? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggles dumping test patterns into file \"<file>_tests.txt\" [default = %s]\n", pPars->fDump?       "yes": "no" );
    Abc_Print( -2, "\t-e      : toggles dumping test pattern pairs (delay faults only) [default = %s]\n", pPars->fDumpDelay? "yes": "no" );
    Abc_Print( -2, "\t-u      : toggles dumping untestable faults into \"<file>_untest.txt\" [default = %s]\n", pPars->fDumpUntest? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggles dumping faults not detected by a given test set [default = %s]\n", pPars->fDumpNewFaults? "yes": "no" );
    Abc_Print( -2, "\t-v      : toggles printing verbose information [default = %s]\n",                  pPars->fVerbose?    "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    Abc_Print( -2, "\t<file>  : (optional) file name with input test patterns\n\n");
    Abc_Print( -2, "\t-G file : (optional) file name with the golden model\n\n");
    Abc_Print( -2, "\t-F file : (optional) file name with the fault model in BLIF format\n");
    Abc_Print( -2, "\t-S str  : (optional) string representing the fault model\n");
    Abc_Print( -2, "\t          The following notations are used:\n");
    Abc_Print( -2, "\t            Functional variables: {a,b} (both a and b are always present)\n");
    Abc_Print( -2, "\t            Parameter variables: {p,q,r,s,t,u,v,w} (any number from 1 to 8)\n");
    Abc_Print( -2, "\t            Boolean operators: AND(&), OR(|), XOR(^), MUX(?:), NOT(~)\n");
    Abc_Print( -2, "\t            Parentheses should be used around each operator. Spaces not allowed.\n");
    Abc_Print( -2, "\t            Complement (~) is only allowed before variables (use DeMorgan law).\n");
    Abc_Print( -2, "\t            Examples:\n");
    Abc_Print( -2, "\t              (((a&b)&~p)|q)        stuck-at-0/1 at the output\n");
    Abc_Print( -2, "\t              (((a&~p)|q)&b)        stuck-at-0/1 at input a\n");
    Abc_Print( -2, "\t              (((a|p)&(b|q))&~r)    stuck-at-1 at the inputs and stuck-at-0 at the output\n");
    Abc_Print( -2, "\t              (((a&~p)&(b&~q))|r)   stuck-at-0 at the inputs and stuck-at-1 at the output\n");
    Abc_Print( -2, "\t              ((a&b)^p)             complement at the output\n");
    Abc_Print( -2, "\t              (((a^p)&(b^q))^r)     complement at the inputs and at the output\n");
    Abc_Print( -2, "\t              (a?(b?~s:r):(b?q:p))  functionally observable fault at the output\n");
    Abc_Print( -2, "\t              (p?(a|b):(a&b))       replace AND by OR\n");
    Abc_Print( -2, "\t           If the BLIF file is used for the formula with option \'-F\', following rules apply:\n");
    Abc_Print( -2, "\t              - the network should be combinational and have exactly one primary output\n");
    Abc_Print( -2, "\t              - input names should have only one character:\n");
    Abc_Print( -2, "\t                {a, b} (for functional variables)\n");
    Abc_Print( -2, "\t                {p,q,r,s,t,u,v,w} (for parameter variables)\n");
    return 1;
}